

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::SearchAltMatch(int iters,int nbytes,SearchImpl *search)

{
  StringPiece local_58 [2];
  string local_38 [8];
  string s;
  SearchImpl *search_local;
  int nbytes_local;
  int iters_local;
  
  StopBenchmarkTiming();
  std::__cxx11::string::string(local_38);
  MakeText((string *)local_38,nbytes);
  BenchmarkMemoryUsage();
  StartBenchmarkTiming();
  StringPiece::StringPiece(local_58,(string *)local_38);
  (*search)(iters,"\\C*",local_58,kAnchored,true);
  SetBenchmarkBytesProcessed((long)iters * (long)nbytes);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void SearchAltMatch(int iters, int nbytes, SearchImpl* search) {
  StopBenchmarkTiming();
  string s;
  MakeText(&s, nbytes);
  BenchmarkMemoryUsage();
  StartBenchmarkTiming();
  search(iters, "\\C*", s, Prog::kAnchored, true);
  SetBenchmarkBytesProcessed(static_cast<int64>(iters)*nbytes);
}